

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::ArgSortLayerParams::SharedCtor(ArgSortLayerParams *this)

{
  ArgSortLayerParams *this_local;
  
  memset(&this->axis_,0,9);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void ArgSortLayerParams::SharedCtor() {
  ::memset(&axis_, 0, reinterpret_cast<char*>(&descending_) -
    reinterpret_cast<char*>(&axis_) + sizeof(descending_));
  _cached_size_ = 0;
}